

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O2

void __thiscall adjMaxtrix<char>::InsertEdge(adjMaxtrix<char> *this,int v1,int v2,int weight)

{
  int **ppiVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (-1 < v1) {
    uVar4 = (long)(this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar2 = (ulong)(uint)v1;
    if ((-1 < v2 && uVar2 < uVar4) && (uVar3 = (ulong)(uint)v2, uVar3 < uVar4)) {
      ppiVar1 = this->edge;
      ppiVar1[uVar3][uVar2] = weight;
      ppiVar1[uVar2][uVar3] = weight;
      this->edgeNum = this->edgeNum + 1;
      return;
    }
  }
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_28d4);
  return;
}

Assistant:

void adjMaxtrix<dataType>::InsertEdge(int v1, int v2, int weight) {
	if (v1 < 0 || v1 >= vexs.size() || v2 < 0 || v2 >= vexs.size()) {
		cout << "插入边v1或v2越界";
		return;
	}
	edge[v1][v2] = edge[v2][v1] = weight;	//插入一条无向边
	edgeNum++;
}